

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O2

Vec_Int_t * Abc_SclFindMinAreas(SC_Lib *pLib,int fUseMax)

{
  Vec_Int_t *p;
  SC_Cell *pRepr;
  SC_Cell *pSVar1;
  SC_Cell *pSVar2;
  int i;
  int iVar3;
  bool bVar4;
  
  p = Vec_IntStartFull((pLib->vCells).nSize);
  for (i = 0; i < (pLib->vCellClasses).nSize; i = i + 1) {
    pRepr = (SC_Cell *)Vec_PtrEntry(&pLib->vCellClasses,i);
    pSVar1 = pRepr;
    if (fUseMax != 0) {
      pSVar1 = Abc_SclFindMaxAreaCell(pRepr);
    }
    iVar3 = 0;
    for (pSVar2 = pRepr; bVar4 = iVar3 == 0, iVar3 = iVar3 + -1, pSVar2 != pRepr || bVar4;
        pSVar2 = pSVar2->pNext) {
      Vec_IntWriteEntry(p,pSVar2->Id,pSVar1->Id);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_SclFindMinAreas( SC_Lib * pLib, int fUseMax )
{
    Vec_Int_t * vMinCells;
    SC_Cell * pCell, * pRepr = NULL, * pBest = NULL;
    int i, k;
    // map each gate in the library into its min/max-size prototype
    vMinCells = Vec_IntStartFull( Vec_PtrSize(&pLib->vCells) );
    SC_LibForEachCellClass( pLib, pRepr, i )
    {
        pBest = fUseMax ? Abc_SclFindMaxAreaCell(pRepr) : pRepr;
        SC_RingForEachCell( pRepr, pCell, k )
            Vec_IntWriteEntry( vMinCells, pCell->Id, pBest->Id );
    }
    return vMinCells;
}